

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

ssize_t send_callback(nghttp2_session *h2,uint8_t *buf,size_t blen,int flags,void *userp)

{
  long lVar1;
  uint in_EAX;
  ssize_t sVar2;
  Curl_easy *data;
  CURLcode result;
  undefined8 uStack_18;
  
  lVar1 = *(long *)((long)userp + 0x10);
  if (userp == (void *)0x0) {
    data = (Curl_easy *)0x0;
  }
  else {
    data = *(Curl_easy **)(lVar1 + 0x10);
  }
  uStack_18 = (ulong)in_EAX;
  sVar2 = Curl_bufq_write_pass
                    ((bufq *)(lVar1 + 0x58),buf,blen,nw_out_writer,userp,
                     (CURLcode *)((long)&uStack_18 + 4));
  if (sVar2 < 0) {
    if (uStack_18._4_4_ != 0x51) {
      Curl_failf(data,"Failed sending HTTP2 data");
      return -0x386;
    }
  }
  else if (sVar2 != 0) {
    return sVar2;
  }
  *(byte *)(lVar1 + 200) = *(byte *)(lVar1 + 200) | 8;
  return -0x1f8;
}

Assistant:

static ssize_t send_callback(nghttp2_session *h2,
                             const uint8_t *buf, size_t blen, int flags,
                             void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct cf_h2_ctx *ctx = cf->ctx;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);
  ssize_t nwritten;
  CURLcode result = CURLE_OK;

  (void)h2;
  (void)flags;
  DEBUGASSERT(data);

  nwritten = Curl_bufq_write_pass(&ctx->outbufq, buf, blen,
                                  nw_out_writer, cf, &result);
  if(nwritten < 0) {
    if(result == CURLE_AGAIN) {
      ctx->nw_out_blocked = 1;
      return NGHTTP2_ERR_WOULDBLOCK;
    }
    failf(data, "Failed sending HTTP2 data");
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  if(!nwritten) {
    ctx->nw_out_blocked = 1;
    return NGHTTP2_ERR_WOULDBLOCK;
  }
  return nwritten;
}